

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

string * __thiscall
pbrt::RandomSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,RandomSampler *this)

{
  RNG *in_R9;
  
  StringPrintf<int_const&,int_const&,pbrt::RNG_const&>
            (__return_storage_ptr__,(pbrt *)"[ RandomSampler samplesPerPixel: %d seed: %d rng: %s ]"
             ,(char *)this,&this->seed,(int *)&this->rng,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string RandomSampler::ToString() const {
    return StringPrintf("[ RandomSampler samplesPerPixel: %d seed: %d rng: %s ]",
                        samplesPerPixel, seed, rng);
}